

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdblookup.c
# Opt level: O2

longdouble * get_time(void)

{
  FILE *__stream;
  int iVar1;
  longdouble *plVar2;
  int *piVar3;
  char *pcVar4;
  undefined4 extraout_var;
  
  plVar2 = (longdouble *)time((time_t *)0x0);
  __stream = _stderr;
  if (plVar2 == (longdouble *)0xffffffffffffffff) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    iVar1 = fprintf(__stream,"time(): %s\n",pcVar4);
    plVar2 = (longdouble *)CONCAT44(extraout_var,iVar1);
  }
  return plVar2;
}

Assistant:

static long double get_time(void) {
    // clock_gettime() is not present on OSX until 10.12.
#ifdef HAVE_CLOCK_GETTIME
    struct timespec tp = {
        .tv_sec = 0,
        .tv_nsec = 0,
    };
    clockid_t clk_id = CLOCK_REALTIME;
#ifdef _POSIX_MONOTONIC_CLOCK
    clk_id = CLOCK_MONOTONIC;
#endif
    if (clock_gettime(clk_id, &tp) != 0) {
        fprintf(stderr, "clock_gettime(): %s\n", strerror(errno));
        return -1;
    }
    return (long double)tp.tv_sec + ((float)tp.tv_nsec / 1e9);
#else
    time_t t = time(NULL);
    if (t == (time_t)-1) {
        fprintf(stderr, "time(): %s\n", strerror(errno));
        return -1;
    }
    return (long double)t;
#endif
}